

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cpp
# Opt level: O2

HashWriter * TaggedHash(HashWriter *__return_storage_ptr__,string *tag)

{
  CSHA256 *this;
  long in_FS_OFFSET;
  uint256 taghash;
  CSHA256 local_b0;
  base_blob<256U> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->ctx).buf[0x30] = '\0';
  (__return_storage_ptr__->ctx).buf[0x31] = '\0';
  (__return_storage_ptr__->ctx).buf[0x32] = '\0';
  (__return_storage_ptr__->ctx).buf[0x33] = '\0';
  (__return_storage_ptr__->ctx).buf[0x34] = '\0';
  (__return_storage_ptr__->ctx).buf[0x35] = '\0';
  (__return_storage_ptr__->ctx).buf[0x36] = '\0';
  (__return_storage_ptr__->ctx).buf[0x37] = '\0';
  (__return_storage_ptr__->ctx).buf[0x38] = '\0';
  (__return_storage_ptr__->ctx).buf[0x39] = '\0';
  (__return_storage_ptr__->ctx).buf[0x3a] = '\0';
  (__return_storage_ptr__->ctx).buf[0x3b] = '\0';
  (__return_storage_ptr__->ctx).buf[0x3c] = '\0';
  (__return_storage_ptr__->ctx).buf[0x3d] = '\0';
  (__return_storage_ptr__->ctx).buf[0x3e] = '\0';
  (__return_storage_ptr__->ctx).buf[0x3f] = '\0';
  (__return_storage_ptr__->ctx).buf[0x20] = '\0';
  (__return_storage_ptr__->ctx).buf[0x21] = '\0';
  (__return_storage_ptr__->ctx).buf[0x22] = '\0';
  (__return_storage_ptr__->ctx).buf[0x23] = '\0';
  (__return_storage_ptr__->ctx).buf[0x24] = '\0';
  (__return_storage_ptr__->ctx).buf[0x25] = '\0';
  (__return_storage_ptr__->ctx).buf[0x26] = '\0';
  (__return_storage_ptr__->ctx).buf[0x27] = '\0';
  (__return_storage_ptr__->ctx).buf[0x28] = '\0';
  (__return_storage_ptr__->ctx).buf[0x29] = '\0';
  (__return_storage_ptr__->ctx).buf[0x2a] = '\0';
  (__return_storage_ptr__->ctx).buf[0x2b] = '\0';
  (__return_storage_ptr__->ctx).buf[0x2c] = '\0';
  (__return_storage_ptr__->ctx).buf[0x2d] = '\0';
  (__return_storage_ptr__->ctx).buf[0x2e] = '\0';
  (__return_storage_ptr__->ctx).buf[0x2f] = '\0';
  (__return_storage_ptr__->ctx).buf[0x10] = '\0';
  (__return_storage_ptr__->ctx).buf[0x11] = '\0';
  (__return_storage_ptr__->ctx).buf[0x12] = '\0';
  (__return_storage_ptr__->ctx).buf[0x13] = '\0';
  (__return_storage_ptr__->ctx).buf[0x14] = '\0';
  (__return_storage_ptr__->ctx).buf[0x15] = '\0';
  (__return_storage_ptr__->ctx).buf[0x16] = '\0';
  (__return_storage_ptr__->ctx).buf[0x17] = '\0';
  (__return_storage_ptr__->ctx).buf[0x18] = '\0';
  (__return_storage_ptr__->ctx).buf[0x19] = '\0';
  (__return_storage_ptr__->ctx).buf[0x1a] = '\0';
  (__return_storage_ptr__->ctx).buf[0x1b] = '\0';
  (__return_storage_ptr__->ctx).buf[0x1c] = '\0';
  (__return_storage_ptr__->ctx).buf[0x1d] = '\0';
  (__return_storage_ptr__->ctx).buf[0x1e] = '\0';
  (__return_storage_ptr__->ctx).buf[0x1f] = '\0';
  (__return_storage_ptr__->ctx).buf[0] = '\0';
  (__return_storage_ptr__->ctx).buf[1] = '\0';
  (__return_storage_ptr__->ctx).buf[2] = '\0';
  (__return_storage_ptr__->ctx).buf[3] = '\0';
  (__return_storage_ptr__->ctx).buf[4] = '\0';
  (__return_storage_ptr__->ctx).buf[5] = '\0';
  (__return_storage_ptr__->ctx).buf[6] = '\0';
  (__return_storage_ptr__->ctx).buf[7] = '\0';
  (__return_storage_ptr__->ctx).buf[8] = '\0';
  (__return_storage_ptr__->ctx).buf[9] = '\0';
  (__return_storage_ptr__->ctx).buf[10] = '\0';
  (__return_storage_ptr__->ctx).buf[0xb] = '\0';
  (__return_storage_ptr__->ctx).buf[0xc] = '\0';
  (__return_storage_ptr__->ctx).buf[0xd] = '\0';
  (__return_storage_ptr__->ctx).buf[0xe] = '\0';
  (__return_storage_ptr__->ctx).buf[0xf] = '\0';
  (__return_storage_ptr__->ctx).s[4] = 0;
  (__return_storage_ptr__->ctx).s[5] = 0;
  (__return_storage_ptr__->ctx).s[6] = 0;
  (__return_storage_ptr__->ctx).s[7] = 0;
  (__return_storage_ptr__->ctx).s[0] = 0;
  (__return_storage_ptr__->ctx).s[1] = 0;
  (__return_storage_ptr__->ctx).s[2] = 0;
  (__return_storage_ptr__->ctx).s[3] = 0;
  (__return_storage_ptr__->ctx).bytes = 0;
  CSHA256::CSHA256(&__return_storage_ptr__->ctx);
  local_48.m_data._M_elems[0x10] = '\0';
  local_48.m_data._M_elems[0x11] = '\0';
  local_48.m_data._M_elems[0x12] = '\0';
  local_48.m_data._M_elems[0x13] = '\0';
  local_48.m_data._M_elems[0x14] = '\0';
  local_48.m_data._M_elems[0x15] = '\0';
  local_48.m_data._M_elems[0x16] = '\0';
  local_48.m_data._M_elems[0x17] = '\0';
  local_48.m_data._M_elems[0x18] = '\0';
  local_48.m_data._M_elems[0x19] = '\0';
  local_48.m_data._M_elems[0x1a] = '\0';
  local_48.m_data._M_elems[0x1b] = '\0';
  local_48.m_data._M_elems[0x1c] = '\0';
  local_48.m_data._M_elems[0x1d] = '\0';
  local_48.m_data._M_elems[0x1e] = '\0';
  local_48.m_data._M_elems[0x1f] = '\0';
  local_48.m_data._M_elems[0] = '\0';
  local_48.m_data._M_elems[1] = '\0';
  local_48.m_data._M_elems[2] = '\0';
  local_48.m_data._M_elems[3] = '\0';
  local_48.m_data._M_elems[4] = '\0';
  local_48.m_data._M_elems[5] = '\0';
  local_48.m_data._M_elems[6] = '\0';
  local_48.m_data._M_elems[7] = '\0';
  local_48.m_data._M_elems[8] = '\0';
  local_48.m_data._M_elems[9] = '\0';
  local_48.m_data._M_elems[10] = '\0';
  local_48.m_data._M_elems[0xb] = '\0';
  local_48.m_data._M_elems[0xc] = '\0';
  local_48.m_data._M_elems[0xd] = '\0';
  local_48.m_data._M_elems[0xe] = '\0';
  local_48.m_data._M_elems[0xf] = '\0';
  CSHA256::CSHA256(&local_b0);
  this = CSHA256::Write(&local_b0,(uchar *)(tag->_M_dataplus)._M_p,tag->_M_string_length);
  CSHA256::Finalize(this,(uchar *)&local_48);
  base_blob<256U>::Serialize<HashWriter>(&local_48,__return_storage_ptr__);
  base_blob<256U>::Serialize<HashWriter>(&local_48,__return_storage_ptr__);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

HashWriter TaggedHash(const std::string& tag)
{
    HashWriter writer{};
    uint256 taghash;
    CSHA256().Write((const unsigned char*)tag.data(), tag.size()).Finalize(taghash.begin());
    writer << taghash << taghash;
    return writer;
}